

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_(lyout *out,lyd_node *root,LYD_FORMAT format,int options)

{
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  lyout *out_local;
  
  if (format == LYD_XML) {
    out_local._4_4_ = xml_print_data(out,root,options);
  }
  else if (format == LYD_JSON) {
    out_local._4_4_ = json_print_data(out,root,options);
  }
  else if (format == LYD_LYB) {
    out_local._4_4_ = lyb_print_data(out,root,options);
  }
  else {
    ly_log(root->schema->module->ctx,LY_LLERR,LY_EINVAL,"Unknown output format.");
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

static int
lyd_print_(struct lyout *out, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    switch (format) {
    case LYD_XML:
        return xml_print_data(out, root, options);
    case LYD_JSON:
        return json_print_data(out, root, options);
    case LYD_LYB:
        return lyb_print_data(out, root, options);
    default:
        LOGERR(root->schema->module->ctx, LY_EINVAL, "Unknown output format.");
        return EXIT_FAILURE;
    }
}